

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O0

string * __thiscall Klex::parseOutNumber_abi_cxx11_(string *__return_storage_ptr__,Klex *this)

{
  bool bVar1;
  CharClass CVar2;
  int iVar3;
  bool onePoint;
  Klex *this_local;
  string *lexeme;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = false;
  while( true ) {
    do {
      CVar2 = getCharClass(this);
      if (CVar2 != DIGIT) {
        return __return_storage_ptr__;
      }
      iVar3 = getChar(this);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar3);
      nextChar(this);
      iVar3 = getChar(this);
    } while (iVar3 != 0x2e);
    if (bVar1) break;
    bVar1 = true;
    getChar(this);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    nextChar(this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Klex::parseOutNumber() {
    std::string lexeme;
    bool onePoint = false;

    while(getCharClass() == CharClass::DIGIT) {
        lexeme += getChar();
        nextChar();

        if(getChar() == '.') {
            if(onePoint)
                break;

            onePoint = true;
            lexeme.push_back(getChar());
            nextChar();
        }
    }

    return lexeme;
}